

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

int IDACreateB(void *ida_mem,int *which)

{
  IDABMemRec *user_data;
  IDAMem ida_mem_00;
  int *in_RSI;
  IDAMem in_RDI;
  IDAadjMem IDAADJ_mem;
  IDABMem new_IDAB_mem;
  void *ida_memB;
  IDAMem IDA_mem;
  IDAadjMemRec *sunctx;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x29a,"IDACreateB",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_adjMallocDone == 0) {
    IDAProcessError(in_RDI,-0x65,0x2a3,"IDACreateB",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                    ,"Illegal attempt to call before calling IDAadjInit.");
    local_4 = -0x65;
  }
  else {
    sunctx = in_RDI->ida_adj_mem;
    user_data = (IDABMemRec *)malloc(0x88);
    if (user_data == (IDABMemRec *)0x0) {
      IDAProcessError(in_RDI,-0x15,0x2ad,"IDACreateB",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                      ,"A memory request failed.");
      local_4 = -0x15;
    }
    else {
      ida_mem_00 = (IDAMem)IDACreate((SUNContext_conflict)sunctx);
      if (ida_mem_00 == (IDAMem)0x0) {
        IDAProcessError(in_RDI,-0x15,0x2b6,"IDACreateB",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                        ,"A memory request failed.");
        local_4 = -0x15;
      }
      else {
        IDASetUserData(ida_mem_00,user_data);
        user_data->ida_index = sunctx->ia_nbckpbs;
        user_data->IDA_mem = ida_mem_00;
        user_data->ida_res = (IDAResFnB)0x0;
        user_data->ida_resS = (IDAResFnBS)0x0;
        user_data->ida_rhsQ = (IDAQuadRhsFnB)0x0;
        user_data->ida_rhsQS = (IDAQuadRhsFnBS)0x0;
        user_data->ida_user_data = (void *)0x0;
        user_data->ida_lmem = (void *)0x0;
        user_data->ida_lfree = (_func_int_IDABMem *)0x0;
        user_data->ida_pmem = (void *)0x0;
        user_data->ida_pfree = (_func_int_IDABMem *)0x0;
        user_data->ida_yy = (N_Vector)0x0;
        user_data->ida_yp = (N_Vector)0x0;
        user_data->ida_res_withSensi = 0;
        user_data->ida_rhsQ_withSensi = 0;
        user_data->ida_next = sunctx->IDAB_mem;
        sunctx->IDAB_mem = user_data;
        *in_RSI = sunctx->ia_nbckpbs;
        sunctx->ia_nbckpbs = sunctx->ia_nbckpbs + 1;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int IDACreateB(void* ida_mem, int* which)
{
  IDAMem IDA_mem;
  void* ida_memB;
  IDABMem new_IDAB_mem;
  IDAadjMem IDAADJ_mem;

  /* Is the mem OK? */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Is ASA initialized ? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Allocate a new IDABMem struct. */
  new_IDAB_mem = (IDABMem)malloc(sizeof(struct IDABMemRec));
  if (new_IDAB_mem == NULL)
  {
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    return (IDA_MEM_FAIL);
  }

  /* Allocate the IDAMem struct needed by this backward problem. */
  ida_memB = IDACreate(IDA_mem->ida_sunctx);
  if (ida_memB == NULL)
  {
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    return (IDA_MEM_FAIL);
  }

  /* Save ida_mem in ida_memB as user data. */
  IDASetUserData(ida_memB, ida_mem);

  /* Initialize fields in the IDABMem struct. */
  new_IDAB_mem->ida_index = IDAADJ_mem->ia_nbckpbs;
  new_IDAB_mem->IDA_mem   = (IDAMem)ida_memB;

  new_IDAB_mem->ida_res   = NULL;
  new_IDAB_mem->ida_resS  = NULL;
  new_IDAB_mem->ida_rhsQ  = NULL;
  new_IDAB_mem->ida_rhsQS = NULL;

  new_IDAB_mem->ida_user_data = NULL;

  new_IDAB_mem->ida_lmem  = NULL;
  new_IDAB_mem->ida_lfree = NULL;
  new_IDAB_mem->ida_pmem  = NULL;
  new_IDAB_mem->ida_pfree = NULL;

  new_IDAB_mem->ida_yy = NULL;
  new_IDAB_mem->ida_yp = NULL;

  new_IDAB_mem->ida_res_withSensi  = SUNFALSE;
  new_IDAB_mem->ida_rhsQ_withSensi = SUNFALSE;

  /* Attach the new object to the beginning of the linked list IDAADJ_mem->IDAB_mem. */
  new_IDAB_mem->ida_next = IDAADJ_mem->IDAB_mem;
  IDAADJ_mem->IDAB_mem   = new_IDAB_mem;

  /* Return the assigned index. This id is used as identificator and has to be passed
     to IDAInitB and other ***B functions that set the optional inputs for  this
     backward problem. */
  *which = IDAADJ_mem->ia_nbckpbs;

  /*Increase the counter of the backward problems stored. */
  IDAADJ_mem->ia_nbckpbs++;

  return (IDA_SUCCESS);
}